

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.c
# Opt level: O0

rt_function_error_t allocate_abs_local_context(rt_function_t *f)

{
  int iVar1;
  long *plVar2;
  rt_variable_getter p_Var3;
  rt_variable_setter p_Var4;
  rt_list_t shape;
  rt_list_t shape_00;
  abs_private_t *p;
  rt_function_t *f_local;
  
  if (f->num_of_inputs == 1) {
    if (f->num_of_outputs == 1) {
      plVar2 = (long *)(*rt_malloc_func)(0x28);
      if (plVar2 == (long *)0x0) {
        f_local._4_4_ = RT_FUNCTION_ERROR_MALLOC;
      }
      else {
        f->local_context = plVar2;
        *plVar2 = (long)*f->inputs;
        p_Var3 = select_getter((rt_variable_t *)*plVar2);
        plVar2[1] = (long)p_Var3;
        shape._4_4_ = 0;
        shape.size = ((*f->inputs)->shape).size;
        shape.data = ((*f->inputs)->shape).data;
        iVar1 = calc_shape_size(shape);
        *(int *)(plVar2 + 4) = iVar1;
        plVar2[2] = (long)*f->outputs;
        p_Var4 = select_setter((rt_variable_t *)plVar2[2]);
        plVar2[3] = (long)p_Var4;
        shape_00._4_4_ = 0;
        shape_00.size = ((*f->outputs)->shape).size;
        shape_00.data = ((*f->outputs)->shape).data;
        iVar1 = calc_shape_size(shape_00);
        *(int *)((long)plVar2 + 0x24) = iVar1;
        if ((int)plVar2[4] == *(int *)((long)plVar2 + 0x24)) {
          if (((*(byte *)(*plVar2 + 0x10) & 0xf) == 0) && ((*(byte *)(plVar2[2] + 0x10) & 0xf) == 0)
             ) {
            f->exec_func = exec_abs;
          }
          else {
            f->exec_func = exec_abs_generic;
          }
          f_local._4_4_ = RT_FUNCTION_ERROR_NOERROR;
        }
        else {
          f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_SHAPE;
        }
      }
    }
    else {
      f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
    }
  }
  else {
    f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  return f_local._4_4_;
}

Assistant:

rt_function_error_t allocate_abs_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  abs_private_t *p = rt_malloc_func(sizeof(abs_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }

  f->local_context = (void *)p;
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);
  p->input_size = calc_shape_size(f->inputs[0]->shape);

  p->output = f->outputs[0];
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(f->outputs[0]->shape);

  if (p->input_size != p->output_size) {
    return RT_FUNCTION_ERROR_INVALID_SHAPE;
  }
  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_ABS_FLOAT32
    f->exec_func = exec_abs;
#endif /* CONFIG_ABS_FLOAT32 */
  } else {
#ifdef CONFIG_ABS_GENERIC
    f->exec_func = exec_abs_generic;
#endif /* CONFIG_ABS_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}